

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int w2r_(int *ldr,int *ldw,int *l,int *m,double *r__,double *w)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  
  uVar1 = *m;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)*ldr;
    uVar4 = (ulong)*ldw;
    iVar2 = *l;
    pdVar5 = r__ + uVar3 + ~uVar3;
    pdVar6 = w + uVar4 + ~uVar4;
    lVar7 = 1;
    do {
      if (0 < iVar2) {
        uVar8 = 1;
        do {
          pdVar5[uVar8] = pdVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (iVar2 + 1 != uVar8);
      }
      lVar7 = lVar7 + 1;
      pdVar5 = pdVar5 + uVar3;
      pdVar6 = pdVar6 + uVar4;
    } while (lVar7 != (ulong)uVar1 + 1);
  }
  return 0;
}

Assistant:

int w2r_(int *ldr, int *ldw, int *l, int *m,
	fft_real_t *r__, fft_real_t *w)
{
    /* System generated locals */
    int r_dim1, r_offset, w_dim1, w_offset, i__1, i__2;

    /* Local variables */
     int i__, j;

    /* Parameter adjustments */
    r_dim1 = *ldr;
    r_offset = 1 + r_dim1;
    r__ -= r_offset;
    w_dim1 = *ldw;
    w_offset = 1 + w_dim1;
    w -= w_offset;

    /* Function Body */
    i__1 = *m;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *l;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    r__[i__ + j * r_dim1] = w[i__ + j * w_dim1];
	}
    }
    return 0;
}